

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rply.cpp
# Opt level: O0

int obinary_float32(p_ply ply,double value)

{
  long in_RDI;
  double in_XMM0_Qa;
  float float32;
  float local_1c [6];
  int local_4;
  
  local_1c[0] = (float)in_XMM0_Qa;
  if ((3.4028234663852886e+38 < in_XMM0_Qa) || (in_XMM0_Qa < -3.4028234663852886e+38)) {
    local_4 = 0;
  }
  else {
    local_4 = (**(code **)(*(long *)(in_RDI + 0x2070) + 0x80))(in_RDI,local_1c,4);
  }
  return local_4;
}

Assistant:

static int obinary_float32(p_ply ply, double value) {
    float float32 = (float)value;
    if (value > FLT_MAX || value < -FLT_MAX) return 0;
    return ply->odriver->ochunk(ply, &float32, sizeof(float32));
}